

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O0

TToken * __thiscall
tcpp::TrySkipWhitespaceTokensSequence<tcpp::Preprocessor::_processInclusion()::__0>
          (TToken *__return_storage_ptr__,tcpp *this,anon_class_8_1_8991fb9c getNextToken,
          TToken *initialToken)

{
  TToken local_60;
  undefined1 local_21;
  Preprocessor *local_20;
  TToken *initialToken_local;
  anon_class_8_1_8991fb9c getNextToken_local;
  TToken *currToken;
  
  local_21 = 0;
  local_20 = getNextToken.this;
  initialToken_local = (TToken *)this;
  getNextToken_local.this = (Preprocessor *)__return_storage_ptr__;
  TToken::TToken(__return_storage_ptr__,(TToken *)getNextToken.this);
  while (__return_storage_ptr__->mType == SPACE) {
    Preprocessor::_processInclusion::anon_class_8_1_8991fb9c::operator()
              (&local_60,(anon_class_8_1_8991fb9c *)&initialToken_local);
    TToken::operator=(__return_storage_ptr__,&local_60);
    TToken::~TToken(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

static TToken TrySkipWhitespaceTokensSequence(TAction getNextToken, const TToken& initialToken)
	{
		TToken currToken = initialToken;

		while (currToken.mType == E_TOKEN_TYPE::SPACE)
		{
			currToken = getNextToken();
		}

		return currToken;
	}